

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMemAddTerminator(Mem *pMem)

{
  int iVar1;
  Mem *pMem_local;
  
  iVar1 = sqlite3VdbeMemGrow(pMem,pMem->n + 2,1);
  if (iVar1 == 0) {
    pMem->z[pMem->n] = '\0';
    pMem->z[pMem->n + 1] = '\0';
    pMem->flags = pMem->flags | 0x200;
    pMem_local._4_4_ = 0;
  }
  else {
    pMem_local._4_4_ = 7;
  }
  return pMem_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int vdbeMemAddTerminator(Mem *pMem){
  if( sqlite3VdbeMemGrow(pMem, pMem->n+2, 1) ){
    return SQLITE_NOMEM_BKPT;
  }
  pMem->z[pMem->n] = 0;
  pMem->z[pMem->n+1] = 0;
  pMem->flags |= MEM_Term;
  return SQLITE_OK;
}